

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::to_regexp_object
          (anon_unknown_35 *this,gc_heap_ptr<mjs::global_object> *global,value *regexp)

{
  value *global_00;
  bool bVar1;
  value_type vVar2;
  global_object *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  gc_heap_ptr<mjs::regexp_object> gVar4;
  string local_50;
  wstring_view local_40;
  gc_heap *local_30;
  gc_heap *h;
  object_ptr *o;
  value *regexp_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  o = (object_ptr *)regexp;
  regexp_local = (value *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  vVar2 = value::type(regexp);
  if (vVar2 == object) {
    h = (gc_heap *)value::object_value((value *)o);
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>((gc_heap_ptr_untyped *)h);
    if (bVar1) {
      gc_heap_ptr<mjs::regexp_object>::gc_heap_ptr<mjs::object,void,void>
                ((gc_heap_ptr<mjs::regexp_object> *)this,(gc_heap_ptr<mjs::object> *)h);
      uVar3 = extraout_RDX;
      goto LAB_001a5242;
    }
  }
  this_00 = gc_heap_ptr<mjs::global_object>::operator->
                      ((gc_heap_ptr<mjs::global_object> *)regexp_local);
  local_30 = object::heap(&this_00->super_object);
  global_00 = regexp_local;
  to_string((mjs *)&local_50,local_30,(value *)o);
  local_40 = string::view(&local_50);
  regexp_object::make((regexp_object *)this,(gc_heap_ptr<mjs::global_object> *)global_00,&local_40,
                      none);
  string::~string(&local_50);
  uVar3 = extraout_RDX_00;
LAB_001a5242:
  gVar4.super_gc_heap_ptr_untyped._8_8_ = uVar3;
  gVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar4.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> to_regexp_object(const gc_heap_ptr<global_object>& global, const value& regexp) {
    if (regexp.type() == value_type::object) {
        const auto& o = regexp.object_value();
        if (o.has_type<regexp_object>()) {
            return gc_heap_ptr<regexp_object>{o};
        }
    }
    auto& h = global->heap();
    return regexp_object::make(global, to_string(h, regexp).view(), regexp_flag::none);
}